

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O2

global_object_create_result *
mjs::make_error_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  native_error_type *pnVar1;
  bool bVar2;
  long *plVar3;
  void *pvVar4;
  char *pcVar5;
  function_object *pfVar6;
  long *plVar7;
  long lVar8;
  wstring_view __x;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  string_view local_128;
  native_error_type error_type;
  object_ptr prototype;
  undefined1 local_100 [16];
  gc_heap_ptr<mjs::function_object> constructor;
  string n;
  undefined1 local_d0 [40];
  gc_heap_ptr_untyped local_a8;
  string_view local_98;
  undefined1 local_88 [16];
  gc_heap_ptr<mjs::function_object> error_constructor;
  object_ptr error_prototype;
  string err_str;
  
  plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar3 + 0x98))(&err_str,plVar3,"Error");
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  pnVar1 = *(native_error_type **)((long)pvVar4 + 8);
  prototype.super_gc_heap_ptr_untyped.heap_._0_4_ = 0;
  plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar3 + 0x58))(local_100,plVar3);
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = (long)"\t" + 1;
  string::string((string *)&local_128,*(gc_heap **)((long)pvVar4 + 8),(string_view *)&n);
  gc_heap::
  make<mjs::error_object,mjs::native_error_type,mjs::string&,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)local_d0,pnVar1,(string *)&prototype,(gc_heap_ptr<mjs::object> *)&err_str,
             (string *)local_100);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            (&error_prototype.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  error_constructor.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  error_constructor.super_gc_heap_ptr_untyped.pos_ = 0;
  lVar8 = 0;
  do {
    if (lVar8 == 0x20) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_98,&global->super_gc_heap_ptr_untyped);
      local_88._0_8_ = (gc_heap *)0x8;
      local_88._8_8_ = "toString";
      string::string((string *)&constructor,(global->super_gc_heap_ptr_untyped).heap_,
                     (string_view *)local_88);
      plVar3 = (long *)gc_heap_ptr_untyped::get(&error_prototype.super_gc_heap_ptr_untyped);
      make_raw_function((mjs *)&prototype,global);
      pfVar6 = (function_object *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
      local_128._M_len = 0;
      local_128._M_str = (char *)((ulong)local_128._M_str & 0xffffffff00000000);
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_100,(size_t)(pfVar6->super_native_object).super_object.heap_);
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_100);
      *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c3a30;
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)&local_98);
      function_object::put_function
                (pfVar6,(gc_heap_ptr<mjs::gc_function> *)local_100,
                 (gc_heap_ptr<mjs::gc_string> *)&constructor,
                 (gc_heap_ptr<mjs::gc_string> *)&local_128,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&n,&prototype.super_gc_heap_ptr_untyped);
      value::value((value *)local_d0,(object_ptr *)&n);
      (**(code **)(*plVar3 + 8))(plVar3,&constructor,local_d0,2);
      value::~value((value *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&n);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&constructor.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_98);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)__return_storage_ptr__,
                 &error_constructor.super_gc_heap_ptr_untyped);
      (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
      (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&error_constructor.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&error_prototype.super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&err_str);
      return __return_storage_ptr__;
    }
    error_type = *(native_error_type *)((long)&native_error_types + lVar8);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    pcVar5 = type_string(error_type);
    (**(code **)(*plVar3 + 0x98))(&n,plVar3,pcVar5);
    if (error_type == generic) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&prototype.super_gc_heap_ptr_untyped,&error_prototype.super_gc_heap_ptr_untyped);
    }
    else {
      pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      pnVar1 = *(native_error_type **)((long)pvVar4 + 8);
      pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      local_128._M_len = 0;
      local_128._M_str = "";
      string::string((string *)local_100,*(gc_heap **)((long)pvVar4 + 8),&local_128);
      gc_heap::
      make<mjs::error_object,mjs::native_error_type_const&,mjs::string&,mjs::gc_heap_ptr<mjs::object>&,mjs::string>
                ((gc_heap *)local_d0,pnVar1,(string *)&error_type,(gc_heap_ptr<mjs::object> *)&n,
                 (string *)&error_prototype);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&prototype.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    }
    local_d0._0_4_ = error_type;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 8),(gc_heap_ptr_untyped *)&n);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)(local_d0 + 0x18),&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_a8,&global->super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    object::class_name((object *)local_88);
    make_raw_function((mjs *)&constructor.super_gc_heap_ptr_untyped,global);
    pfVar6 = (function_object *)gc_heap_ptr_untyped::get(&constructor.super_gc_heap_ptr_untyped);
    local_128._M_len = 0;
    local_128._M_str = (char *)((ulong)local_128._M_str & 0xffffffff00000000);
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_100,(size_t)(pfVar6->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_100);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c39f0;
    *(undefined4 *)((long)pvVar4 + 0x10) = local_d0._0_4_;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x18),(gc_heap_ptr_untyped *)(local_d0 + 8));
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x28),(gc_heap_ptr_untyped *)(local_d0 + 0x18)
              );
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar4 + 0x38),&local_a8)
    ;
    function_object::put_function
              (pfVar6,(gc_heap_ptr<mjs::gc_function> *)local_100,
               (gc_heap_ptr<mjs::gc_string> *)local_88,(gc_heap_ptr<mjs::gc_string> *)&local_128,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    make_error_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::~__0((__0 *)local_d0);
    pfVar6 = (function_object *)gc_heap_ptr_untyped::get(&constructor.super_gc_heap_ptr_untyped);
    function_object::default_construct_function(pfVar6);
    pfVar6 = (function_object *)gc_heap_ptr_untyped::get(&constructor.super_gc_heap_ptr_untyped);
    function_object::put_prototype_with_attributes
              (pfVar6,&prototype,dont_delete|dont_enum|read_only);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar7 + 0x98))((gc_heap *)local_100,plVar7,"constructor");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&local_128,&constructor.super_gc_heap_ptr_untyped);
    value::value((value *)local_d0,(object_ptr *)&local_128);
    (**(code **)(*plVar3 + 0x28))(plVar3,(gc_heap *)local_100,(value *)local_d0,2);
    value::~value((value *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&prototype.super_gc_heap_ptr_untyped);
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    local_128._M_len = 7;
    local_128._M_str = "message";
    string::string((string *)local_100,*(gc_heap **)((long)pvVar4 + 8),&local_128);
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    local_98._M_len = 0;
    local_98._M_str = "";
    string::string((string *)local_88,*(gc_heap **)((long)pvVar4 + 8),&local_98);
    value::value((value *)local_d0,(string *)local_88);
    (**(code **)(*plVar3 + 8))(plVar3,(gc_heap *)local_100,(value *)local_d0,6);
    value::~value((value *)local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    if (error_constructor.super_gc_heap_ptr_untyped.heap_ == (gc_heap *)0x0) {
      __x = string::view(&n);
      __y._M_str = L"Error";
      __y._M_len = 5;
      bVar2 = std::operator==(__x,__y);
      if (!bVar2) {
        __assert_fail("n.view() == L\"Error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp"
                      ,0x7c,
                      "global_object_create_result mjs::make_error_object(const gc_heap_ptr<global_object> &)"
                     );
      }
      gc_heap_ptr_untyped::operator=
                (&error_constructor.super_gc_heap_ptr_untyped,&constructor.super_gc_heap_ptr_untyped
                );
    }
    else {
      plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)local_100,&constructor.super_gc_heap_ptr_untyped);
      value::value((value *)local_d0,(object_ptr *)local_100);
      (**(code **)(*plVar3 + 8))(plVar3,&n,(value *)local_d0,2);
      value::~value((value *)local_d0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&constructor.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&prototype.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&n);
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

global_object_create_result make_error_object(const gc_heap_ptr<global_object>& global) {
    auto err_str = global->common_string("Error");

    object_ptr error_prototype = global->heap().make<error_object>(native_error_type::generic, err_str, global->object_prototype(), string{global->heap(), ""});

    gc_heap_ptr<function_object> error_constructor;
    for (const auto error_type: native_error_types) {
        auto n = global->common_string(type_string(error_type));
        auto prototype = error_type == native_error_type::generic ? error_prototype : global->heap().make<error_object>(error_type, n, error_prototype, string{global->heap(), ""});
        auto constructor = make_function(global, [error_type, n, prototype, global](const value&, const std::vector<value>& args) {
            auto& h = global->heap();
            auto eo = h.make<error_object>(error_type, n, prototype, string{h, global->stack_trace()});
            if (!args.empty() && args.front().type() != value_type::undefined) {
                eo->put(global->common_string("message"), value{to_string(h, args.front())}, message_attributes);
            }
            return value{eo};
        }, prototype->class_name().unsafe_raw_get(), 1);
        constructor->default_construct_function();

        constructor->put_prototype_with_attributes(prototype, global_object::prototype_attributes);

        prototype->redefine_own_property(global->common_string("constructor"), value{constructor}, global_object::default_attributes);
        prototype->put(string{global->heap(), "message"}, value{string{global->heap(), ""}}, message_attributes);

        if (!error_constructor) {
            assert(n.view() == L"Error");
            error_constructor = constructor;
        } else {
            global->put(n, value{constructor}, property_attribute::dont_enum);
        }
    }

    put_native_function(global, error_prototype, "toString", [global](const value& this_, const std::vector<value>&) {
        if (this_.type() == value_type::object) {
            auto& o = this_.object_value();
            if (o.has_type<error_object>()) {
                return value{static_cast<const error_object&>(*o).to_string()};
            }
        }
        return value{global->common_string("Error")};
    }, 0);

    return { error_constructor, nullptr };
}